

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O0

void filter_horz(uint8_t *dst,int dst_stride,AV1_DEBLOCKING_PARAMETERS *params,
                SequenceHeader *seq_params,USE_FILTER_TYPE use_filter_type)

{
  int iVar1;
  uint8_t *puVar2;
  uint16_t *puVar3;
  long in_RCX;
  undefined1 *in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  char in_R8B;
  uint8_t *unaff_retaddr;
  uint8_t *in_stack_00000008;
  uint8_t *in_stack_00000010;
  uint8_t *in_stack_00000018;
  undefined4 in_stack_00000020;
  int in_stack_00000024;
  uint16_t *in_stack_00000028;
  uchar *in_stack_00000030;
  undefined4 in_stack_00000038;
  int in_stack_0000003c;
  undefined4 in_stack_00000040;
  int in_stack_00000044;
  uint16_t *in_stack_00000048;
  uint16_t *dst_shortptr;
  aom_bit_depth_t bit_depth;
  int use_highbitdepth;
  loop_filter_thresh *limits;
  undefined7 in_stack_00000068;
  undefined4 in_stack_00000080;
  undefined4 in_stack_00000090;
  int in_stack_00000094;
  uint16_t *in_stack_00000098;
  uint8_t *in_stack_000000a0;
  uint8_t *in_stack_000000a8;
  int in_stack_000000b4;
  uint16_t *in_stack_000000b8;
  uchar *in_stack_000000d8;
  uchar *in_stack_000000e0;
  uchar *in_stack_000000e8;
  int in_stack_000000f4;
  uchar *in_stack_000000f8;
  int in_stack_00000104;
  uint8_t *in_stack_00000108;
  uint8_t *in_stack_00000110;
  uint8_t *in_stack_00000118;
  int in_stack_00000124;
  uint16_t *in_stack_00000128;
  uchar *in_stack_00000188;
  uchar *in_stack_00000190;
  uchar *in_stack_00000198;
  int in_stack_000001a4;
  uchar *in_stack_000001a8;
  uchar *in_stack_00000a30;
  uchar *in_stack_00000a38;
  uint8_t *in_stack_00000f00;
  uint8_t *in_stack_00000f08;
  int in_stack_00000f10;
  uchar *in_stack_00001200;
  uchar *in_stack_00001208;
  uint8_t *in_stack_00001650;
  uint8_t *in_stack_00001658;
  uchar *in_stack_00002890;
  uchar *in_stack_00002898;
  
  puVar2 = *(uint8_t **)(in_RDX + 8);
  iVar1 = *(int *)(in_RCX + 0x48);
  if (*(char *)(in_RCX + 0x4c) == '\0') {
    if (in_R8B == '\x02') {
      switch(*in_RDX) {
      case 4:
        aom_lpf_horizontal_4_quad_sse2
                  (in_stack_000001a8,in_stack_000001a4,in_stack_00000198,in_stack_00000190,
                   in_stack_00000188);
        break;
      default:
        break;
      case 6:
        (*aom_lpf_horizontal_6_quad)(in_RDI,in_ESI,puVar2,puVar2 + 0x10,puVar2 + 0x20);
        break;
      case 8:
        (*aom_lpf_horizontal_8_quad)(in_RDI,in_ESI,puVar2,puVar2 + 0x10,puVar2 + 0x20);
        break;
      case 0xe:
        (*aom_lpf_horizontal_14_quad)(in_RDI,in_ESI,puVar2,puVar2 + 0x10,puVar2 + 0x20);
      }
    }
    else if (in_R8B == '\x01') {
      switch(*in_RDX) {
      case 4:
        aom_lpf_horizontal_4_dual_sse2
                  (_bit_depth,dst_shortptr._4_4_,(uchar *)in_stack_00000048,
                   (uchar *)CONCAT44(in_stack_00000044,in_stack_00000040),
                   (uchar *)CONCAT44(in_stack_0000003c,in_stack_00000038),in_stack_00000030,
                   in_stack_00000a30,in_stack_00000a38);
        break;
      default:
        break;
      case 6:
        aom_lpf_horizontal_6_dual_sse2
                  ((uchar *)in_stack_00000048,in_stack_00000044,
                   (uchar *)CONCAT44(in_stack_0000003c,in_stack_00000038),in_stack_00000030,
                   (uchar *)in_stack_00000028,(uchar *)CONCAT44(in_stack_00000024,in_stack_00000020)
                   ,in_stack_00001200,in_stack_00001208);
        break;
      case 8:
        aom_lpf_horizontal_8_dual_sse2
                  ((uint8_t *)in_stack_00000098,in_stack_00000094,dst,
                   (uint8_t *)CONCAT44(dst_stride,in_stack_00000080),&params->filter_length,
                   (uint8_t *)seq_params,in_stack_00001650,in_stack_00001658);
        break;
      case 0xe:
        aom_lpf_horizontal_14_dual_sse2
                  (dst,dst_stride,&params->filter_length,(uchar *)seq_params,
                   (uchar *)CONCAT17(use_filter_type,in_stack_00000068),limits->mblim,
                   in_stack_00002890,in_stack_00002898);
      }
    }
    else {
      switch(*in_RDX) {
      case 4:
        aom_lpf_horizontal_4_sse2
                  ((uint8_t *)in_stack_00000028,in_stack_00000024,in_stack_00000018,
                   in_stack_00000010,in_stack_00000008);
        break;
      default:
        break;
      case 6:
        aom_lpf_horizontal_6_sse2
                  ((uchar *)CONCAT44(in_stack_00000044,in_stack_00000040),in_stack_0000003c,
                   in_stack_00000030,(uchar *)in_stack_00000028,
                   (uchar *)CONCAT44(in_stack_00000024,in_stack_00000020));
        break;
      case 8:
        aom_lpf_horizontal_8_sse2
                  ((uchar *)CONCAT44(in_stack_00000094,in_stack_00000090),dst._4_4_,
                   (uchar *)CONCAT44(dst_stride,in_stack_00000080),&params->filter_length,
                   (uchar *)seq_params);
        break;
      case 0xe:
        aom_lpf_horizontal_14_sse2
                  (in_stack_000000f8,in_stack_000000f4,in_stack_000000e8,in_stack_000000e0,
                   in_stack_000000d8);
      }
    }
  }
  else {
    puVar3 = (uint16_t *)((long)in_RDI * 2);
    if (in_R8B == '\x02') {
      switch(*in_RDX) {
      case 4:
        (*aom_highbd_lpf_horizontal_4_dual)
                  (puVar3,in_ESI,puVar2,puVar2 + 0x10,puVar2 + 0x20,puVar2,puVar2 + 0x10,
                   puVar2 + 0x20,iVar1);
        (*aom_highbd_lpf_horizontal_4_dual)
                  (puVar3 + 8,in_ESI,puVar2,puVar2 + 0x10,puVar2 + 0x20,puVar2,puVar2 + 0x10,
                   puVar2 + 0x20,iVar1);
        break;
      default:
        break;
      case 6:
        aom_highbd_lpf_horizontal_6_dual_sse2
                  (in_stack_00000028,in_stack_00000024,in_stack_00000018,in_stack_00000010,
                   in_stack_00000008,unaff_retaddr,in_stack_00000f00,in_stack_00000f08,
                   in_stack_00000f10);
        aom_highbd_lpf_horizontal_6_dual_sse2
                  (in_stack_00000028,in_stack_00000024,in_stack_00000018,in_stack_00000010,
                   in_stack_00000008,unaff_retaddr,in_stack_00000f00,in_stack_00000f08,
                   in_stack_00000f10);
        break;
      case 8:
        (*aom_highbd_lpf_horizontal_8_dual)
                  (puVar3,in_ESI,puVar2,puVar2 + 0x10,puVar2 + 0x20,puVar2,puVar2 + 0x10,
                   puVar2 + 0x20,iVar1);
        (*aom_highbd_lpf_horizontal_8_dual)
                  (puVar3 + 8,in_ESI,puVar2,puVar2 + 0x10,puVar2 + 0x20,puVar2,puVar2 + 0x10,
                   puVar2 + 0x20,iVar1);
        break;
      case 0xe:
        (*aom_highbd_lpf_horizontal_14_dual)
                  (puVar3,in_ESI,puVar2,puVar2 + 0x10,puVar2 + 0x20,puVar2,puVar2 + 0x10,
                   puVar2 + 0x20,iVar1);
        (*aom_highbd_lpf_horizontal_14_dual)
                  (puVar3 + 8,in_ESI,puVar2,puVar2 + 0x10,puVar2 + 0x20,puVar2,puVar2 + 0x10,
                   puVar2 + 0x20,iVar1);
      }
    }
    else if (in_R8B == '\x01') {
      switch(*in_RDX) {
      case 4:
        (*aom_highbd_lpf_horizontal_4_dual)
                  (puVar3,in_ESI,puVar2,puVar2 + 0x10,puVar2 + 0x20,puVar2,puVar2 + 0x10,
                   puVar2 + 0x20,iVar1);
        break;
      default:
        break;
      case 6:
        aom_highbd_lpf_horizontal_6_dual_sse2
                  (in_stack_00000028,in_stack_00000024,in_stack_00000018,in_stack_00000010,
                   in_stack_00000008,unaff_retaddr,in_stack_00000f00,in_stack_00000f08,
                   in_stack_00000f10);
        break;
      case 8:
        (*aom_highbd_lpf_horizontal_8_dual)
                  (puVar3,in_ESI,puVar2,puVar2 + 0x10,puVar2 + 0x20,puVar2,puVar2 + 0x10,
                   puVar2 + 0x20,iVar1);
        break;
      case 0xe:
        (*aom_highbd_lpf_horizontal_14_dual)
                  (puVar3,in_ESI,puVar2,puVar2 + 0x10,puVar2 + 0x20,puVar2,puVar2 + 0x10,
                   puVar2 + 0x20,iVar1);
      }
    }
    else {
      switch(*in_RDX) {
      case 4:
        aom_highbd_lpf_horizontal_4_sse2
                  (in_stack_00000048,in_stack_00000044,
                   (uint8_t *)CONCAT44(in_stack_0000003c,in_stack_00000038),in_stack_00000030,
                   (uint8_t *)in_stack_00000028,in_stack_00000024);
        break;
      default:
        break;
      case 6:
        aom_highbd_lpf_horizontal_6_sse2
                  (in_stack_00000098,in_stack_00000094,dst,
                   (uint8_t *)CONCAT44(dst_stride,in_stack_00000080),&params->filter_length,
                   seq_params._4_4_);
        break;
      case 8:
        aom_highbd_lpf_horizontal_8_sse2
                  (in_stack_000000b8,in_stack_000000b4,in_stack_000000a8,in_stack_000000a0,
                   (uint8_t *)in_stack_00000098,in_stack_00000094);
        break;
      case 0xe:
        aom_highbd_lpf_horizontal_14_sse2
                  (in_stack_00000128,in_stack_00000124,in_stack_00000118,in_stack_00000110,
                   in_stack_00000108,in_stack_00000104);
      }
    }
  }
  return;
}

Assistant:

static inline void filter_horz(uint8_t *dst, int dst_stride,
                               const AV1_DEBLOCKING_PARAMETERS *params,
                               const SequenceHeader *seq_params,
                               USE_FILTER_TYPE use_filter_type) {
  const loop_filter_thresh *limits = params->lfthr;
#if CONFIG_AV1_HIGHBITDEPTH
  const int use_highbitdepth = seq_params->use_highbitdepth;
  const aom_bit_depth_t bit_depth = seq_params->bit_depth;
  if (use_highbitdepth) {
    uint16_t *dst_shortptr = CONVERT_TO_SHORTPTR(dst);
    if (use_filter_type == USE_QUAD) {
      switch (params->filter_length) {
        // apply 4-tap filtering
        case 4:
          aom_highbd_lpf_horizontal_4_dual(
              dst_shortptr, dst_stride, limits->mblim, limits->lim,
              limits->hev_thr, limits->mblim, limits->lim, limits->hev_thr,
              bit_depth);
          aom_highbd_lpf_horizontal_4_dual(
              dst_shortptr + (2 * MI_SIZE), dst_stride, limits->mblim,
              limits->lim, limits->hev_thr, limits->mblim, limits->lim,
              limits->hev_thr, bit_depth);
          break;
        case 6:  // apply 6-tap filter for chroma plane only
          aom_highbd_lpf_horizontal_6_dual(
              dst_shortptr, dst_stride, limits->mblim, limits->lim,
              limits->hev_thr, limits->mblim, limits->lim, limits->hev_thr,
              bit_depth);
          aom_highbd_lpf_horizontal_6_dual(
              dst_shortptr + (2 * MI_SIZE), dst_stride, limits->mblim,
              limits->lim, limits->hev_thr, limits->mblim, limits->lim,
              limits->hev_thr, bit_depth);
          break;
        // apply 8-tap filtering
        case 8:
          aom_highbd_lpf_horizontal_8_dual(
              dst_shortptr, dst_stride, limits->mblim, limits->lim,
              limits->hev_thr, limits->mblim, limits->lim, limits->hev_thr,
              bit_depth);
          aom_highbd_lpf_horizontal_8_dual(
              dst_shortptr + (2 * MI_SIZE), dst_stride, limits->mblim,
              limits->lim, limits->hev_thr, limits->mblim, limits->lim,
              limits->hev_thr, bit_depth);
          break;
        // apply 14-tap filtering
        case 14:
          aom_highbd_lpf_horizontal_14_dual(
              dst_shortptr, dst_stride, limits->mblim, limits->lim,
              limits->hev_thr, limits->mblim, limits->lim, limits->hev_thr,
              bit_depth);
          aom_highbd_lpf_horizontal_14_dual(
              dst_shortptr + (2 * MI_SIZE), dst_stride, limits->mblim,
              limits->lim, limits->hev_thr, limits->mblim, limits->lim,
              limits->hev_thr, bit_depth);
          break;
        // no filtering
        default: break;
      }
    } else if (use_filter_type == USE_DUAL) {
      switch (params->filter_length) {
        // apply 4-tap filtering
        case 4:
          aom_highbd_lpf_horizontal_4_dual(
              dst_shortptr, dst_stride, limits->mblim, limits->lim,
              limits->hev_thr, limits->mblim, limits->lim, limits->hev_thr,
              bit_depth);
          break;
        case 6:  // apply 6-tap filter for chroma plane only
          aom_highbd_lpf_horizontal_6_dual(
              dst_shortptr, dst_stride, limits->mblim, limits->lim,
              limits->hev_thr, limits->mblim, limits->lim, limits->hev_thr,
              bit_depth);
          break;
        // apply 8-tap filtering
        case 8:
          aom_highbd_lpf_horizontal_8_dual(
              dst_shortptr, dst_stride, limits->mblim, limits->lim,
              limits->hev_thr, limits->mblim, limits->lim, limits->hev_thr,
              bit_depth);
          break;
        // apply 14-tap filtering
        case 14:
          aom_highbd_lpf_horizontal_14_dual(
              dst_shortptr, dst_stride, limits->mblim, limits->lim,
              limits->hev_thr, limits->mblim, limits->lim, limits->hev_thr,
              bit_depth);
          break;
        // no filtering
        default: break;
      }
    } else {
      assert(use_filter_type == USE_SINGLE);
      switch (params->filter_length) {
        // apply 4-tap filtering
        case 4:
          aom_highbd_lpf_horizontal_4(dst_shortptr, dst_stride, limits->mblim,
                                      limits->lim, limits->hev_thr, bit_depth);
          break;
        case 6:  // apply 6-tap filter for chroma plane only
          aom_highbd_lpf_horizontal_6(dst_shortptr, dst_stride, limits->mblim,
                                      limits->lim, limits->hev_thr, bit_depth);
          break;
        // apply 8-tap filtering
        case 8:
          aom_highbd_lpf_horizontal_8(dst_shortptr, dst_stride, limits->mblim,
                                      limits->lim, limits->hev_thr, bit_depth);
          break;
        // apply 14-tap filtering
        case 14:
          aom_highbd_lpf_horizontal_14(dst_shortptr, dst_stride, limits->mblim,
                                       limits->lim, limits->hev_thr, bit_depth);
          break;
        // no filtering
        default: break;
      }
    }
    return;
  }
#endif  // CONFIG_AV1_HIGHBITDEPTH
  if (use_filter_type == USE_QUAD) {
    // Only one set of loop filter parameters (mblim, lim and hev_thr) is
    // passed as argument to quad loop filter because quad loop filter is
    // called for those cases where all the 4 set of loop filter parameters
    // are equal.
    switch (params->filter_length) {
      // apply 4-tap filtering
      case 4:
        aom_lpf_horizontal_4_quad(dst, dst_stride, limits->mblim, limits->lim,
                                  limits->hev_thr);
        break;
      case 6:  // apply 6-tap filter for chroma plane only
        aom_lpf_horizontal_6_quad(dst, dst_stride, limits->mblim, limits->lim,
                                  limits->hev_thr);
        break;
      // apply 8-tap filtering
      case 8:
        aom_lpf_horizontal_8_quad(dst, dst_stride, limits->mblim, limits->lim,
                                  limits->hev_thr);
        break;
      // apply 14-tap filtering
      case 14:
        aom_lpf_horizontal_14_quad(dst, dst_stride, limits->mblim, limits->lim,
                                   limits->hev_thr);
        break;
      // no filtering
      default: break;
    }
  } else if (use_filter_type == USE_DUAL) {
    switch (params->filter_length) {
      // apply 4-tap filtering
      case 4:
        aom_lpf_horizontal_4_dual(dst, dst_stride, limits->mblim, limits->lim,
                                  limits->hev_thr, limits->mblim, limits->lim,
                                  limits->hev_thr);
        break;
      case 6:  // apply 6-tap filter for chroma plane only
        aom_lpf_horizontal_6_dual(dst, dst_stride, limits->mblim, limits->lim,
                                  limits->hev_thr, limits->mblim, limits->lim,
                                  limits->hev_thr);
        break;
      // apply 8-tap filtering
      case 8:
        aom_lpf_horizontal_8_dual(dst, dst_stride, limits->mblim, limits->lim,
                                  limits->hev_thr, limits->mblim, limits->lim,
                                  limits->hev_thr);
        break;
      // apply 14-tap filtering
      case 14:
        aom_lpf_horizontal_14_dual(dst, dst_stride, limits->mblim, limits->lim,
                                   limits->hev_thr, limits->mblim, limits->lim,
                                   limits->hev_thr);
        break;
      // no filtering
      default: break;
    }
  } else {
    assert(use_filter_type == USE_SINGLE);
    switch (params->filter_length) {
      // apply 4-tap filtering
      case 4:
        aom_lpf_horizontal_4(dst, dst_stride, limits->mblim, limits->lim,
                             limits->hev_thr);
        break;
      case 6:  // apply 6-tap filter for chroma plane only
        aom_lpf_horizontal_6(dst, dst_stride, limits->mblim, limits->lim,
                             limits->hev_thr);
        break;
      // apply 8-tap filtering
      case 8:
        aom_lpf_horizontal_8(dst, dst_stride, limits->mblim, limits->lim,
                             limits->hev_thr);
        break;
      // apply 14-tap filtering
      case 14:
        aom_lpf_horizontal_14(dst, dst_stride, limits->mblim, limits->lim,
                              limits->hev_thr);
        break;
      // no filtering
      default: break;
    }
  }
#if !CONFIG_AV1_HIGHBITDEPTH
  (void)seq_params;
#endif  // !CONFIG_AV1_HIGHBITDEPTH
}